

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O1

void __thiscall cppforth::Forth::buffer(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  _Rb_tree_header *p_Var1;
  _Rb_tree_color _Var2;
  uint uVar3;
  mapped_type *pmVar4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  long lVar7;
  bool bVar8;
  Cell u;
  char buffer [1024];
  _Rb_tree_color local_42c;
  Char local_428 [1024];
  
  requireDStackDepth(this,1,"BUFFER");
  requireDStackAvailable(this,1,"BUFFER");
  this_00 = &this->dStack;
  local_42c = ForthStack<unsigned_int>::getTop(this_00);
  if (local_42c != _S_red) {
    p_Var1 = &(this->blocksInProcess)._M_t._M_impl.super__Rb_tree_header;
    p_Var6 = (this->blocksInProcess)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var5 = &p_Var1->_M_header;
    for (; p_Var6 != (_Base_ptr)0x0; p_Var6 = (&p_Var6->_M_left)[bVar8]) {
      bVar8 = p_Var6[1]._M_color < local_42c;
      if (!bVar8) {
        p_Var5 = p_Var6;
      }
    }
    p_Var6 = &p_Var1->_M_header;
    if (((_Rb_tree_header *)p_Var5 != p_Var1) && (p_Var6 = p_Var5, local_42c < p_Var5[1]._M_color))
    {
      p_Var6 = &p_Var1->_M_header;
    }
    if ((_Rb_tree_header *)p_Var6 == p_Var1) {
      memset(local_428,0x20,0x400);
      ForthStack<unsigned_int>::setTop(this_00,0x400);
      memAllocate(this);
      ForthStack<unsigned_int>::getTop(this_00);
      ForthStack<unsigned_int>::pop(this_00);
      uVar3 = ForthStack<unsigned_int>::getTop(this_00);
      lVar7 = 0;
      do {
        dataSpaceSet(this,uVar3 + (int)lVar7,local_428[lVar7]);
        _Var2 = local_42c;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 0x400);
      pmVar4 = std::
               map<unsigned_int,_cppforth::Forth::BlockInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_cppforth::Forth::BlockInfo>_>_>
               ::operator[](&this->blocksInProcess,&local_42c);
      pmVar4->blockNumber = _Var2;
      pmVar4->blockLocation = uVar3;
      *(undefined4 *)&pmVar4->blockModified = 0;
    }
    else {
      ForthStack<unsigned_int>::setTop(this_00,*(uint *)&p_Var6[1]._M_parent);
    }
    this->blockCurrent = local_42c;
  }
  return;
}

Assistant:

void buffer(){
			REQUIRE_DSTACK_DEPTH(1, "BUFFER");
			REQUIRE_DSTACK_AVAILABLE(1, "BUFFER");
			Cell u = dStack.getTop();
			if (u > 0) {
				auto foundIt = blocksInProcess.find(u);
				if (foundIt != blocksInProcess.end()) {
					dStack.setTop((*foundIt).second.blockLocation);
				}
				else {
						char buffer[1024];
						std::memset(buffer, ' ', 1024);
						// get memory
						dStack.setTop(1024);
						memAllocate();
						auto ec = dStack.getTop(); pop();
						// copy to memory
						auto address = dStack.getTop();
						moveIntoDataSpace(address, buffer, 1024);
						// save block info
						struct BlockInfo newBlock {};
						newBlock.blockNumber = u;
						newBlock.blockLocation = address;
						newBlock.blockModified = false;
						blocksInProcess[u] = newBlock;
						// push address - address already on stack top
				}
				blockCurrent = u;
			}

		}